

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,char *value)

{
  char spec;
  size_t in_RCX;
  void *in_RDX;
  cstring_spec_handler local_30;
  char *local_20;
  char *value_local;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *this_local;
  
  local_20 = value;
  value_local = (char *)this;
  if (this->specs_ == (format_specs *)0x0) {
    write(this,(int)value,in_RDX,in_RCX);
    this_local = (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)(this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                    container;
  }
  else {
    spec = this->specs_->type;
    cstring_spec_handler::cstring_spec_handler(&local_30,this,value);
    handle_cstring_type_spec<char,fmt::v7::detail::arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>::cstring_spec_handler>
              (spec,&local_30);
    this_local = (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)(this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                    container;
  }
  return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)this_local;
}

Assistant:

iterator operator()(const Char* value) {
    if (!specs_) return write(value), out_;
    handle_cstring_type_spec(specs_->type, cstring_spec_handler(*this, value));
    return out_;
  }